

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

int anon_unknown.dwarf_4123ca::syslog_logger::priority_code(priority p)

{
  int local_c;
  priority p_local;
  
  switch(p) {
  case emergency:
    local_c = 0;
    break;
  case alert:
    local_c = 1;
    break;
  case critical:
    local_c = 2;
    break;
  case error:
    local_c = 3;
    break;
  case warning:
    local_c = 4;
    break;
  case notice:
    local_c = 5;
    break;
  case info:
    local_c = 6;
    break;
  case debug:
    local_c = 7;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int syslog_logger::priority_code (priority const p) noexcept {
        switch (p) {
        case priority::emergency: return LOG_EMERG;
        case priority::alert: return LOG_ALERT;
        case priority::critical: return LOG_CRIT;
        case priority::error: return LOG_ERR;
        case priority::warning: return LOG_WARNING;
        case priority::notice: return LOG_NOTICE;
        case priority::info: return LOG_INFO;
        case priority::debug: return LOG_DEBUG;
        }
        return LOG_EMERG;
    }